

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modkey.c
# Opt level: O0

int ffmkfm(fitsfile *fptr,char *keyname,double *value,int decim,char *comm,int *status)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *in_R8;
  int *in_R9;
  char card [81];
  char oldcomm [73];
  char tmpstring [71];
  char valstring [71];
  int *in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe78;
  int in_stack_fffffffffffffe84;
  double in_stack_fffffffffffffe88;
  int *in_stack_fffffffffffffeb8;
  char *in_stack_fffffffffffffec0;
  char *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffed0;
  fitsfile *in_stack_fffffffffffffed8;
  int *in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  fitsfile *in_stack_fffffffffffffef0;
  char local_d8 [64];
  int *in_stack_ffffffffffffff68;
  char *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  int local_4;
  
  if (*in_R9 < 1) {
    iVar1 = ffgkey(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                   in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
    if (iVar1 < 1) {
      strcpy(&stack0xffffffffffffff78,"(");
      ffd2f(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
            in_stack_fffffffffffffe70);
      sVar2 = strlen(local_d8);
      if (sVar2 + 3 < 0x47) {
        strcat(&stack0xffffffffffffff78,local_d8);
        strcat(&stack0xffffffffffffff78,", ");
        ffd2f(in_stack_fffffffffffffe88,in_stack_fffffffffffffe84,in_stack_fffffffffffffe78,
              in_stack_fffffffffffffe70);
        sVar2 = strlen(&stack0xffffffffffffff78);
        sVar3 = strlen(local_d8);
        if (sVar2 + sVar3 + 1 < 0x47) {
          strcat(&stack0xffffffffffffff78,local_d8);
          strcat(&stack0xffffffffffffff78,")");
          if ((in_R8 == (char *)0x0) || (*in_R8 == '&')) {
            ffmkky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
          else {
            ffmkky(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                   in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
          }
          ffmkey(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
          local_4 = *in_R9;
        }
        else {
          ffpmsg((char *)0x20ee3d);
          *in_R9 = 0x192;
          local_4 = 0x192;
        }
      }
      else {
        ffpmsg((char *)0x20ed8d);
        *in_R9 = 0x192;
        local_4 = 0x192;
      }
    }
    else {
      local_4 = *in_R9;
    }
  }
  else {
    local_4 = *in_R9;
  }
  return local_4;
}

Assistant:

int ffmkfm(fitsfile *fptr,          /* I - FITS file pointer  */
           const char *keyname,     /* I - keyword name       */
           double *value,           /* I - keyword value      */
           int decim,               /* I - no of decimals     */
           const char *comm,        /* I - keyword comment    */
           int *status)             /* IO - error status      */
{
    char valstring[FLEN_VALUE], tmpstring[FLEN_VALUE];
    char oldcomm[FLEN_COMMENT];
    char card[FLEN_CARD];

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    if (ffgkey(fptr, keyname, valstring, oldcomm, status) > 0)
        return(*status);                               /* get old comment */

    strcpy(valstring, "(" );
    ffd2f(value[0], decim, tmpstring, status); /* convert to string */
    if (strlen(tmpstring)+3 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ", ");
    ffd2f(value[1], decim, tmpstring, status); /* convert to string */
    if (strlen(valstring) + strlen(tmpstring)+1 > FLEN_VALUE-1)
    {
       ffpmsg("complex key value too long (ffmkfm)");
       return(*status=BAD_F2C);
    }
    strcat(valstring, tmpstring);
    strcat(valstring, ")");

    if (!comm || comm[0] == '&')  /* preserve the current comment string */
        ffmkky(keyname, valstring, oldcomm, card, status);
    else
        ffmkky(keyname, valstring, comm, card, status);

    ffmkey(fptr, card, status);

    return(*status);
}